

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGLSLnoperspectiveTests.cpp
# Opt level: O0

void gl3cts::link_program
               (Context *context,GLuint fragment_shader_id,GLuint vertex_shader_id,
               GLuint program_object_id)

{
  code *pcVar1;
  undefined4 uVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  reference pvVar7;
  TestContext *this;
  TestLog *this_00;
  MessageBuilder *pMVar8;
  TestError *this_01;
  reference local_1e0;
  MessageBuilder local_1d8;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> message;
  GLint length;
  GLint status;
  Functions *gl;
  GLuint program_object_id_local;
  GLuint vertex_shader_id_local;
  GLuint fragment_shader_id_local;
  Context *context_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext(context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  if (fragment_shader_id != 0) {
    (**(code **)(lVar6 + 0x10))(program_object_id,fragment_shader_id);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"AttachShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x8f);
  }
  if (vertex_shader_id != 0) {
    (**(code **)(lVar6 + 0x10))(program_object_id,vertex_shader_id);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"AttachShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x95);
  }
  (**(code **)(lVar6 + 0xce8))(program_object_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"LinkProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x9a);
  (**(code **)(lVar6 + 0x9d8))
            (program_object_id,0x8b82,
             &message.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x9e);
  if (message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ != 1) {
    message.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_48);
    (**(code **)(lVar6 + 0x9d8))
              (program_object_id,0x8b84,
               &message.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"GetProgramiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0xa8);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)local_48,
               (long)(int)message.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_);
    uVar2 = message.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
    pcVar1 = *(code **)(lVar6 + 0x988);
    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_48,0);
    (*pcVar1)(program_object_id,uVar2,0,pvVar7);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"GetProgramInfoLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0xae);
    this = deqp::Context::getTestContext(context);
    this_00 = tcu::TestContext::getLog(this);
    tcu::TestLog::operator<<(&local_1d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [25])"Failed to link program:\n");
    local_1e0 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_48,0);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1e0);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Failed to link program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
               ,0xb4);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void link_program(deqp::Context& context, glw::GLuint fragment_shader_id, glw::GLuint vertex_shader_id,
				  glw::GLuint program_object_id)
{
	/* GL entry points */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* Link status */
	glw::GLint status = GL_FALSE;

	/* Attach shaders */
	if (0 != fragment_shader_id)
	{
		gl.attachShader(program_object_id, fragment_shader_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
	}

	if (0 != vertex_shader_id)
	{
		gl.attachShader(program_object_id, vertex_shader_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
	}

	/* Link */
	gl.linkProgram(program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "LinkProgram");

	/* Get link status */
	gl.getProgramiv(program_object_id, GL_LINK_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

	/* Log link error */
	if (GL_TRUE != status)
	{
		glw::GLint				 length = 0;
		std::vector<glw::GLchar> message;

		/* Get error log length */
		gl.getProgramiv(program_object_id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

		message.resize(length);

		/* Get error log */
		gl.getProgramInfoLog(program_object_id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

		/* Log */
		context.getTestContext().getLog() << tcu::TestLog::Message << "Failed to link program:\n"
										  << &message[0] << tcu::TestLog::EndMessage;

		TCU_FAIL("Failed to link program");
	}
}